

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O0

string * __thiscall Type::DataSize_abi_cxx11_(Type *this,Output *out_cc,Env *env,DataPtr *data)

{
  bool bVar1;
  uint uVar2;
  ID *pIVar3;
  ID *in_RCX;
  Env *in_RDX;
  Env *in_RSI;
  Type *in_RDI;
  undefined8 in_R8;
  int ss;
  Type *in_stack_ffffffffffffff90;
  Type *id;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  if (in_RSI[4].id_map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    EvalLengthExpr_abi_cxx11_(in_RDI,(Output *)in_RSI,in_RDX);
    return (string *)in_RDI;
  }
  id = in_RDI;
  uVar2 = (*(code *)in_RSI->parent[2].context_object_)(in_RSI,in_RCX);
  if (-1 < (int)uVar2) {
    strfmt_abi_cxx11_((char *)in_RDI,"%d",(ulong)uVar2);
    return (string *)id;
  }
  pIVar3 = size_var(in_stack_ffffffffffffff90);
  if (pIVar3 != (ID *)0x0) {
    pIVar3 = in_RCX;
    size_var(in_stack_ffffffffffffff90);
    bVar1 = Env::Evaluated((Env *)in_RDI,pIVar3);
    if (bVar1) goto LAB_001507a8;
  }
  (**(code **)&in_RSI->parent[2].allow_undefined_id_)(in_RSI,in_RDX,in_RCX,in_R8);
LAB_001507a8:
  size_var(in_stack_ffffffffffffff90);
  Env::RValue(in_RSI,(ID *)id);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd3);
  return (string *)id;
}

Assistant:

string Type::DataSize(Output* out_cc, Env* env, const DataPtr& data)
	{
	if ( attr_length_expr_ )
		return EvalLengthExpr(out_cc, env);

	int ss = StaticSize(env);
	if ( ss >= 0 )
		{
		return strfmt("%d", ss);
		}
	else
		{
		if ( ! size_var() || ! env->Evaluated(size_var()) )
			{
			ASSERT(out_cc != 0);
			GenDynamicSize(out_cc, env, data);
			ASSERT(size_var());
			}
		return env->RValue(size_var());
		}
	}